

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

BranchInstr * __thiscall
Lowerer::InsertMissingItemCompareBranch
          (Lowerer *this,Opnd *compareSrc,OpCode opcode,LabelInstr *target,Instr *insertBeforeInstr)

{
  code *pcVar1;
  IRType type;
  bool bVar2;
  Opnd *missingItemOpnd_00;
  undefined4 *puVar3;
  Opnd *missingItemOpnd;
  Instr *insertBeforeInstr_local;
  LabelInstr *target_local;
  OpCode opcode_local;
  Opnd *compareSrc_local;
  Lowerer *this_local;
  
  type = IR::Opnd::GetType(compareSrc);
  missingItemOpnd_00 = GetMissingItemOpndForCompare(type,this->m_func);
  bVar2 = IR::Opnd::IsFloat64(compareSrc);
  if (bVar2) {
    bVar2 = IR::Opnd::IsRegOpnd(compareSrc);
    if (!bVar2) {
      bVar2 = IR::Opnd::IsIndirOpnd(compareSrc);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x465c,"(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd())",
                           "compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    this_local = (Lowerer *)
                 LowererMD::InsertMissingItemCompareBranch
                           (&this->m_lowererMD,compareSrc,missingItemOpnd_00,opcode,target,
                            insertBeforeInstr);
  }
  else {
    bVar2 = IR::Opnd::IsInt32(compareSrc);
    if (!bVar2) {
      bVar2 = IR::Opnd::IsVar(compareSrc);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4661,"(compareSrc->IsInt32() || compareSrc->IsVar())",
                           "compareSrc->IsInt32() || compareSrc->IsVar()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    this_local = (Lowerer *)
                 InsertCompareBranch(this,missingItemOpnd_00,compareSrc,opcode,target,
                                     insertBeforeInstr,true);
  }
  return (BranchInstr *)this_local;
}

Assistant:

IR::BranchInstr*
Lowerer::InsertMissingItemCompareBranch(IR::Opnd* compareSrc, Js::OpCode opcode, IR::LabelInstr* target, IR::Instr* insertBeforeInstr)
{
    IR::Opnd* missingItemOpnd = GetMissingItemOpndForCompare(compareSrc->GetType(), m_func);
    if (compareSrc->IsFloat64())
    {
        Assert(compareSrc->IsRegOpnd() || compareSrc->IsIndirOpnd());
        return m_lowererMD.InsertMissingItemCompareBranch(compareSrc, missingItemOpnd, opcode, target, insertBeforeInstr);
    }
    else
    {
        Assert(compareSrc->IsInt32() || compareSrc->IsVar());
        return InsertCompareBranch(missingItemOpnd, compareSrc, opcode, target, insertBeforeInstr, true);
    }
}